

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O3

Result ValidateTonkSocketConfig(TonkSocketConfig *config)

{
  uint uVar1;
  undefined8 *puVar2;
  ErrorResult *extraout_RAX;
  ErrorResult *extraout_RAX_00;
  ErrorResult *extraout_RAX_01;
  ErrorResult *extraout_RAX_02;
  ErrorResult *extraout_RAX_03;
  ErrorResult *extraout_RAX_04;
  ErrorResult *extraout_RAX_05;
  ErrorResult *extraout_RAX_06;
  ErrorResult *extraout_RAX_07;
  ErrorResult *extraout_RAX_08;
  Result RVar3;
  ErrorResult *extraout_RAX_09;
  Result *success;
  long in_RSI;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  if (*(uint *)(in_RSI + 0x34) < 30000) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"UDPConnectIntervalUsec < 30 ms invalid","");
    puVar2 = (undefined8 *)operator_new(0x38);
    *puVar2 = "ValidateTonkSocketConfig";
    puVar2[1] = puVar2 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),local_38,local_38 + local_30);
    RVar3.Error = extraout_RAX;
  }
  else if (*(uint *)(in_RSI + 0x34) < 0xf4241) {
    if (*(uint *)(in_RSI + 0x38) < 1000000) {
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"ConnectionTimeoutUsec < 1 second invalid","");
      puVar2 = (undefined8 *)operator_new(0x38);
      *puVar2 = "ValidateTonkSocketConfig";
      puVar2[1] = puVar2 + 3;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),local_38,local_38 + local_30)
      ;
      RVar3.Error = extraout_RAX_01;
    }
    else if (*(uint *)(in_RSI + 0x38) < 0xaba9501) {
      if (*(uint *)(in_RSI + 0x1c) != 0) {
        if (*(long *)(in_RSI + 0x50) == 0) {
          local_38 = local_28;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,"OnIncomingConnection null","");
          puVar2 = (undefined8 *)operator_new(0x38);
          *puVar2 = "ValidateTonkSocketConfig";
          puVar2[1] = puVar2 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar2 + 1),local_38,local_38 + local_30);
          RVar3.Error = extraout_RAX_06;
          goto LAB_00114455;
        }
        if (0xffff < *(uint *)(in_RSI + 0x1c)) {
          local_38 = local_28;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"UDPPort invalid","");
          puVar2 = (undefined8 *)operator_new(0x38);
          *puVar2 = "ValidateTonkSocketConfig";
          puVar2[1] = puVar2 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar2 + 1),local_38,local_38 + local_30);
          RVar3.Error = extraout_RAX_03;
          goto LAB_00114455;
        }
      }
      if (*(uint *)(in_RSI + 0x2c) < 5000) {
        local_38 = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"TimerIntervalMsec < TONK_TIMER_INTERVAL_MIN invalid","");
        puVar2 = (undefined8 *)operator_new(0x38);
        *puVar2 = "ValidateTonkSocketConfig";
        puVar2[1] = puVar2 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar2 + 1),local_38,local_38 + local_30);
        RVar3.Error = extraout_RAX_04;
      }
      else if (*(uint *)(in_RSI + 0x2c) < 0x186a1) {
        uVar1 = *(uint *)(in_RSI + 0x30);
        if (uVar1 < 2000000) {
          local_38 = local_28;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,"NoDataTimeoutUsec < TONK_NO_DATA_TIMEOUT_USEC_MIN invalid"
                     ,"");
          puVar2 = (undefined8 *)operator_new(0x38);
          *puVar2 = "ValidateTonkSocketConfig";
          puVar2[1] = puVar2 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar2 + 1),local_38,local_38 + local_30);
          RVar3.Error = extraout_RAX_07;
        }
        else {
          if (uVar1 < 0x23c34601) {
            *(undefined8 *)config = 0;
            return (Result)(ErrorResult *)(ulong)uVar1;
          }
          local_38 = local_28;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_38,"NoDataTimeoutUsec > TONK_NO_DATA_TIMEOUT_USEC_MAX invalid"
                     ,"");
          puVar2 = (undefined8 *)operator_new(0x38);
          *puVar2 = "ValidateTonkSocketConfig";
          puVar2[1] = puVar2 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar2 + 1),local_38,local_38 + local_30);
          RVar3.Error = extraout_RAX_08;
        }
      }
      else {
        local_38 = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"TimerIntervalMsec > TONK_TIMER_INTERVAL_MAX invalid","");
        puVar2 = (undefined8 *)operator_new(0x38);
        *puVar2 = "ValidateTonkSocketConfig";
        puVar2[1] = puVar2 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar2 + 1),local_38,local_38 + local_30);
        RVar3.Error = extraout_RAX_05;
      }
    }
    else {
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"ConnectionTimeoutUsec > 3 minutes invalid","");
      puVar2 = (undefined8 *)operator_new(0x38);
      *puVar2 = "ValidateTonkSocketConfig";
      puVar2[1] = puVar2 + 3;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),local_38,local_38 + local_30)
      ;
      RVar3.Error = extraout_RAX_02;
    }
  }
  else {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"UDPConnectIntervalUsec > 1 second invalid","");
    puVar2 = (undefined8 *)operator_new(0x38);
    *puVar2 = "ValidateTonkSocketConfig";
    puVar2[1] = puVar2 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar2 + 1),local_38,local_38 + local_30);
    RVar3.Error = extraout_RAX_00;
  }
LAB_00114455:
  *(undefined4 *)(puVar2 + 5) = 0;
  puVar2[6] = 1;
  *(undefined8 **)config = puVar2;
  if (local_38 != local_28) {
    operator_delete(local_38);
    RVar3.Error = extraout_RAX_09;
  }
  return (Result)RVar3.Error;
}

Assistant:

static Result ValidateTonkSocketConfig(const TonkSocketConfig* config)
{
    if (config->UDPConnectIntervalUsec < 30 * 1000) {
        return Result("ValidateTonkSocketConfig", "UDPConnectIntervalUsec < 30 ms invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->UDPConnectIntervalUsec > 1000 * 1000) {
        return Result("ValidateTonkSocketConfig", "UDPConnectIntervalUsec > 1 second invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->ConnectionTimeoutUsec < 1000 * 1000) {
        return Result("ValidateTonkSocketConfig", "ConnectionTimeoutUsec < 1 second invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->ConnectionTimeoutUsec > 3 * 60 * 1000 * 1000) {
        return Result("ValidateTonkSocketConfig", "ConnectionTimeoutUsec > 3 minutes invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    // OnIncomingConnection is null if no new connections are allowed.
    // OnOutgoingConnection is null if no outgoing connections will be made
    // OnP2PConnectionStart is null if no P2P connections are allowed
    // or if no connection callback is needed.

    // If UDP port is set but incoming connection is not set:
    if (config->UDPListenPort != 0 && !config->OnIncomingConnection) {
        return Result("ValidateTonkSocketConfig", "OnIncomingConnection null", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->UDPListenPort > 65535) {
        return Result("ValidateTonkSocketConfig", "UDPPort invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->TimerIntervalUsec < TONK_TIMER_INTERVAL_MIN) {
        return Result("ValidateTonkSocketConfig", "TimerIntervalMsec < TONK_TIMER_INTERVAL_MIN invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->TimerIntervalUsec > TONK_TIMER_INTERVAL_MAX) {
        return Result("ValidateTonkSocketConfig", "TimerIntervalMsec > TONK_TIMER_INTERVAL_MAX invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->NoDataTimeoutUsec < TONK_NO_DATA_TIMEOUT_USEC_MIN) {
        return Result("ValidateTonkSocketConfig", "NoDataTimeoutUsec < TONK_NO_DATA_TIMEOUT_USEC_MIN invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->NoDataTimeoutUsec > TONK_NO_DATA_TIMEOUT_USEC_MAX) {
        return Result("ValidateTonkSocketConfig", "NoDataTimeoutUsec > TONK_NO_DATA_TIMEOUT_USEC_MAX invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    return Result::Success();
}